

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

bool i4_is_prime(int n)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  
  if (n < 1) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (3 < n) {
      dVar4 = (double)n;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (1 < (int)dVar4) {
        uVar2 = 2;
        do {
          iVar1 = (int)((ulong)(uint)n % uVar2);
          bVar3 = iVar1 != 0;
          if ((int)dVar4 == (int)uVar2) {
            return bVar3;
          }
          uVar2 = (ulong)((int)uVar2 + 1);
        } while (iVar1 != 0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool i4_is_prime ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_PRIME reports whether an I4 is prime.
//
//  Method:
//
//    A simple, unoptimized sieve of Erasthosthenes is used to
//    check whether N can be divided by any integer between 2
//    and SQRT(N).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be tested.
//
//    Output, bool I4_IS_PRIME, is TRUE if N is prime, and FALSE
//    otherwise.  Note that negative numbers and 0 are not
//    considered prime.
//
{
  int i;
  int nhi;

  if ( n <= 0 )
  {
    return false;
  }

  if ( n <= 3 )
  {
    return true;
  }

  nhi = int( sqrt ( double(n) ) );

  for ( i = 2; i <= nhi; i++ )
  {
    if ( ( n % i ) == 0 )
    {
      return false;
    }
  }

  return true;
}